

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

pair<unsigned_long,_bool> __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base*>,phmap::priv::HashEq<cs::statement_base*,void>::Hash,phmap::priv::HashEq<cs::statement_base*,void>::Eq,std::allocator<cs::statement_base*>>
::find_or_prepare_insert<cs::statement_base*>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
           *this,statement_base **key,size_t hashval)

{
  bool bVar1;
  uint32_t uVar2;
  size_t sVar3;
  size_t in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
  *in_RSI;
  long *in_RDI;
  pair<unsigned_long,_bool> pVar5;
  uint32_t i;
  BitMask<unsigned_int,_16,_0> __end4;
  BitMask<unsigned_int,_16,_0> __begin4;
  BitMask<unsigned_int,_16,_0> *__range4;
  Group g;
  probe_seq<16UL> seq;
  GroupSse2Impl *in_stack_ffffffffffffff48;
  EqualElement<cs::statement_base_*> *f;
  undefined7 in_stack_ffffffffffffff60;
  bool in_stack_ffffffffffffff67;
  size_t local_98;
  uint local_90;
  bool local_89;
  size_t in_stack_ffffffffffffff78;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
  *in_stack_ffffffffffffff80;
  BitMask<unsigned_int,_16,_0> local_6c;
  BitMask<unsigned_int,_16,_0> local_68;
  BitMask<unsigned_int,_16,_0> local_64;
  BitMask<unsigned_int,_16,_0> *local_60;
  GroupSse2Impl local_58;
  probe_seq<16UL> local_40;
  size_t local_28;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
  *local_20;
  pair<unsigned_long,_bool> local_10;
  
  local_28 = in_RDX;
  local_20 = in_RSI;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
  ::probe((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
           *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),(size_t)in_RDI);
  while( true ) {
    f = (EqualElement<cs::statement_base_*> *)*in_RDI;
    sVar3 = probe_seq<16UL>::offset(&local_40);
    GroupSse2Impl::GroupSse2Impl(&local_58,(ctrl_t *)((long)&f->rhs + sVar3));
    H2(local_28);
    local_64 = GroupSse2Impl::Match
                         ((GroupSse2Impl *)
                          CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                          (h2_t)((ulong)in_RDI >> 0x38));
    local_60 = &local_64;
    local_68 = BitMask<unsigned_int,_16,_0>::begin(local_60);
    local_6c = BitMask<unsigned_int,_16,_0>::end
                         ((BitMask<unsigned_int,_16,_0> *)in_stack_ffffffffffffff48);
    while( true ) {
      bVar1 = priv::operator!=(&local_68,&local_6c);
      if (!bVar1) break;
      uVar2 = BitMask<unsigned_int,_16,_0>::operator*((BitMask<unsigned_int,_16,_0> *)0x56f46d);
      in_stack_ffffffffffffff80 = local_20;
      raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
      ::eq_ref((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
                *)0x56f488);
      in_stack_ffffffffffffff48 = (GroupSse2Impl *)in_RDI[1];
      probe_seq<16UL>::offset(&local_40,(ulong)uVar2);
      hash_policy_traits<phmap::priv::FlatHashSetPolicy<cs::statement_base*>,void>::
      element<phmap::priv::FlatHashSetPolicy<cs::statement_base*>>((slot_type *)0x56f4bd);
      bVar1 = hash_policy_traits<phmap::priv::FlatHashSetPolicy<cs::statement_base*>,void>::
              apply<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base*>,phmap::priv::HashEq<cs::statement_base*,void>::Hash,phmap::priv::HashEq<cs::statement_base*,void>::Eq,std::allocator<cs::statement_base*>>::EqualElement<cs::statement_base*>,cs::statement_base*&,phmap::priv::FlatHashSetPolicy<cs::statement_base*>>
                        (f,(statement_base **)in_stack_ffffffffffffff48);
      if (bVar1) {
        probe_seq<16UL>::offset(&local_40,(ulong)uVar2);
        local_89 = false;
        std::pair<unsigned_long,_bool>::pair<unsigned_long,_bool,_true>
                  (&local_10,(unsigned_long *)&stack0xffffffffffffff78,&local_89);
        uVar4 = extraout_RDX;
        goto LAB_0056f57e;
      }
      BitMask<unsigned_int,_16,_0>::operator++(&local_68);
    }
    local_90 = (uint)GroupSse2Impl::MatchEmpty(in_stack_ffffffffffffff48);
    bVar1 = BitMask::operator_cast_to_bool((BitMask *)&local_90);
    if (bVar1) break;
    probe_seq<16UL>::next(&local_40);
  }
  local_98 = raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
             ::prepare_insert(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::pair<unsigned_long,_bool>::pair<unsigned_long,_bool,_true>
            (&local_10,&local_98,(bool *)&stack0xffffffffffffff67);
  uVar4 = extraout_RDX_00;
LAB_0056f57e:
  pVar5._9_7_ = (undefined7)((ulong)uVar4 >> 8);
  pVar5.second = local_10.second;
  pVar5.first = local_10.first;
  return pVar5;
}

Assistant:

std::pair<size_t, bool> find_or_prepare_insert(const K& key, size_t hashval)
			{
				auto seq = probe(hashval);
				while (true) {
					Group g{ctrl_ + seq.offset()};
					for (uint32_t i : g.Match((h2_t)H2(hashval))) {
						if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
						                           EqualElement<K> {key, eq_ref()},
						                           PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
							return {seq.offset((size_t)i), false};
					}
					if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
					seq.next();
				}
				return {prepare_insert(hashval), true};
			}